

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coptccal.cpp
# Opt level: O2

int32_t __thiscall icu_63::CopticCalendar::handleGetExtendedYear(CopticCalendar *this)

{
  int iVar1;
  UCalendarDateFields UVar2;
  int32_t iVar3;
  
  UVar2 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  iVar3 = 1;
  if (UVar2 == UCAL_EXTENDED_YEAR) {
    if (0 < (this->super_CECalendar).super_Calendar.fStamp[0x13]) {
      iVar3 = (this->super_CECalendar).super_Calendar.fFields[0x13];
    }
  }
  else {
    iVar1 = (this->super_CECalendar).super_Calendar.fStamp[1];
    if (((this->super_CECalendar).super_Calendar.fStamp[0] < 1) ||
       ((this->super_CECalendar).super_Calendar.fFields[0] != 0)) {
      if (0 < iVar1) {
        iVar3 = (this->super_CECalendar).super_Calendar.fFields[1];
      }
    }
    else {
      iVar3 = 0;
      if (0 < iVar1) {
        iVar3 = 1 - (this->super_CECalendar).super_Calendar.fFields[1];
      }
    }
  }
  return iVar3;
}

Assistant:

int32_t
CopticCalendar::handleGetExtendedYear()
{
    int32_t eyear;
    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR) {
        eyear = internalGet(UCAL_EXTENDED_YEAR, 1); // Default to year 1
    } else {
        // The year defaults to the epoch start, the era to CE
        int32_t era = internalGet(UCAL_ERA, CE);
        if (era == BCE) {
            eyear = 1 - internalGet(UCAL_YEAR, 1); // Convert to extended year
        } else {
            eyear = internalGet(UCAL_YEAR, 1); // Default to year 1
        }
    }
    return eyear;
}